

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O2

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  element_type *this_00;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  shared_ptr<Image> img_baseline_result;
  shared_ptr<Image> img;
  __shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_70 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Image::fromPNG((Image *)(local_70 + 0x20),&this->input_file);
  local_88._M_ptr = (Image *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar1 = std::chrono::_V2::system_clock::now();
  runWaterEffect((Image *)local_70,(WaterEffectOptions *)local_70._32_8_);
  std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_88,(__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  lVar2 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Full pipeline (baseline): ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
  poVar3 = std::operator<<(poVar3," s.");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = local_88._M_ptr;
  if (local_88._M_ptr != (Image *)0x0) {
    std::operator+(&local_40,"output/",&(this->water_opts).img_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_40,"_result.png");
    Image::toPNG(this_00,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this->cuda == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Project was built without CUDA support.\nSkipping CUDA pipeline and test."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  return;
}

Assistant:

void run() {
    // Load the image.
    auto img = Image::fromPNG(input_file);
    std::shared_ptr<Image> img_baseline_result;

    Timer tt;

    // Start the total pipeline measurement.
    tt.start();
    img_baseline_result = runWaterEffect(img.get(), &water_opts);
    // Stop the timer for the baseline pipeline.
    tt.stop();
    std::cout << "Full pipeline (baseline): " << tt.seconds() << " s." << std::endl;


    // Save the final result if any image was produced
    if (img_baseline_result != nullptr) {
      img_baseline_result->toPNG("output/" + water_opts.img_name + "_result.png");
    }

    // Run the whole pipeline using CUDA
    if (cuda) {
#ifdef USE_CUDA
      tt.start();
      auto img_cuda_result = runWaterEffectCUDA(img.get(), &water_opts);
      tt.stop();
      std::cout << "Full pipeline (CUDA):     " << tt.seconds() << " s." << std::endl;

      if (img_cuda_result != nullptr) {
        img_cuda_result->toPNG("output/" + water_opts.img_name + "_result.png");
      } else {
        std::cerr << "CUDA water effect returned nullptr. Cannot output PNG." << std::endl;
      }

      // Compare the CUDA implementation to the baseline if testing is enabled
      if (test) {
        if (img_cuda_result != nullptr) {
          if (img_cuda_result->is_approximately_equal_to(img_baseline_result.get())) {
            std::cout << "Test passed." << std::endl;
          } else {
            std::cout << "Test failed." << std::endl;
          }
        } else {
          std::cerr << "CUDA water effect returned nullptr. Cannot test approximate equality." << std::endl;
        }
      }
#else
      std::cout << "Project was built without CUDA support.\n"
                   "Skipping CUDA pipeline and test." << std::endl;
#endif
    }
  }